

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::emplaceInst<mocker::ir::Comment,char_const(&)[1]>
          (BuilderContext *this,char (*args) [1])

{
  shared_ptr<mocker::ir::IRInst> local_38;
  undefined1 local_28 [8];
  shared_ptr<mocker::ir::Comment> inst;
  char (*args_local) [1];
  BuilderContext *this_local;
  
  inst.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args;
  std::make_shared<mocker::ir::Comment,char_const(&)[1]>((char (*) [1])local_28);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Comment,void>
            (&local_38,(shared_ptr<mocker::ir::Comment> *)local_28);
  appendInst(this,&local_38);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_38);
  std::shared_ptr<mocker::ir::Comment>::~shared_ptr((shared_ptr<mocker::ir::Comment> *)local_28);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }